

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O0

char * lib_find_vsn_suffix(char *name_string,char suffix_char,char *default_vsn,size_t *name_len)

{
  char *pcVar1;
  bool bVar2;
  char *vsn;
  size_t *name_len_local;
  char *default_vsn_local;
  char suffix_char_local;
  char *name_string_local;
  
  vsn = name_string;
  while( true ) {
    bVar2 = false;
    if (*vsn != '\0') {
      bVar2 = *vsn != suffix_char;
    }
    if (!bVar2) break;
    vsn = vsn + 1;
  }
  *name_len = (long)vsn - (long)name_string;
  pcVar1 = default_vsn;
  if (*vsn == suffix_char) {
    pcVar1 = vsn + 1;
  }
  vsn = pcVar1;
  return vsn;
}

Assistant:

const char *lib_find_vsn_suffix(const char *name_string, char suffix_char,
                                const char *default_vsn, size_t *name_len)
{
    const char *vsn;
    
    /* find the suffix character, if any */
    for (vsn = name_string ; *vsn != '\0' && *vsn != suffix_char ; ++vsn);

    /* note the length of the name portion */
    *name_len = vsn - name_string;

    /* 
     *   skip the separator if we found one, to point vsn at the start of
     *   the suffix string itself - it we didn't find the separator
     *   character, use the default version string
     */
    if (*vsn == suffix_char)
        ++vsn;
    else
        vsn = default_vsn;

    /* return the version string */
    return vsn;
}